

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalNinjaGenerator::OpenFileStream
          (cmGlobalNinjaGenerator *this,
          unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *stream,
          string *name)

{
  bool bVar1;
  byte bVar2;
  cmake *this_00;
  string *str;
  type pcVar3;
  undefined1 local_b1;
  undefined1 local_b0 [56];
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string path;
  string *name_local;
  unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *stream_local;
  cmGlobalNinjaGenerator *this_local;
  
  path.field_2._8_8_ = name;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)stream);
  if (!bVar1) {
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    str = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
    cmAlphaNum::cmAlphaNum(&local_78,str);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)(local_b0 + 8),'/');
    cmStrCat<std::__cxx11::string>
              ((string *)local_48,&local_78,(cmAlphaNum *)(local_b0 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               path.field_2._8_8_);
    local_b1 = None;
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[5])();
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&,bool,codecvt::Encoding>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               (bool *)local_48,(Encoding *)&local_b1);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
              (stream,(unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                       *)local_b0);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               local_b0);
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(stream);
    bVar2 = std::ios::operator!((ios *)((long)&(pcVar3->super_ofstream).
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream +
                                       (long)(pcVar3->super_ofstream).
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream[-3]));
    bVar1 = (bVar2 & 1) != 0;
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(stream);
      WriteDisclaimer(this,(ostream *)pcVar3);
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) goto LAB_0038f572;
  }
  this_local._7_1_ = 1;
LAB_0038f572:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGlobalNinjaGenerator::OpenFileStream(
  std::unique_ptr<cmGeneratedFileStream>& stream, const std::string& name)
{
  // Get a stream where to generate things.
  if (!stream) {
    // Compute Ninja's build file path.
    std::string path =
      cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(), '/', name);
    stream = cm::make_unique<cmGeneratedFileStream>(
      path, false, this->GetMakefileEncoding());
    if (!(*stream)) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return false;
    }

    // Write the do not edit header.
    this->WriteDisclaimer(*stream);
  }

  return true;
}